

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O1

void __thiscall
Shell::EqualityProxyMono::addLocalAxioms(EqualityProxyMono *this,UnitList **units,TermList sort)

{
  UnitList *pUVar1;
  uint uVar2;
  Literal *pLVar3;
  Clause *pCVar4;
  UnitList *pUVar5;
  ulong uVar6;
  EqualityProxyMono *pEVar7;
  Stack<Kernel::Literal_*> *pSVar8;
  EqualityProxyMono *pEVar9;
  Stack<Kernel::Literal_*> *pSVar10;
  Stack<Kernel::Literal_*> *pSVar11;
  Stack<Kernel::Literal_*> *pSVar12;
  Stack<Kernel::Literal_*> *pSVar13;
  Stack<Kernel::Literal_*> *pSVar14;
  Stack<Kernel::Literal_*> local_68;
  TermList local_48;
  undefined8 local_40;
  
  pSVar8 = &local_68;
  pSVar10 = &local_68;
  pSVar11 = &local_68;
  pSVar12 = &local_68;
  pSVar13 = &local_68;
  pSVar14 = &local_68;
  local_68._cursor = (Literal **)0x0;
  local_68._end = (Literal **)0x0;
  local_68._capacity = 0;
  local_68._stack = (Literal **)0x0;
  uVar2 = getProxyPredicate(this,sort);
  local_48._content = 1;
  local_40 = 1;
  pEVar7 = (EqualityProxyMono *)(ulong)uVar2;
  pLVar3 = Kernel::Literal::create(uVar2,2,true,&local_48);
  if (local_68._cursor == local_68._end) {
    ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
    pEVar7 = (EqualityProxyMono *)pSVar8;
  }
  *local_68._cursor = pLVar3;
  local_68._cursor = local_68._cursor + 1;
  pCVar4 = createEqProxyAxiom(pEVar7,&local_68);
  pUVar1 = *units;
  pEVar7 = (EqualityProxyMono *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
  pEVar9 = pEVar7;
  pUVar5 = (UnitList *)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  pUVar5->_head = &pCVar4->super_Unit;
  pUVar5->_tail = pUVar1;
  *units = pUVar5;
  if (this->_opt - RS < 3) {
    local_68._cursor = local_68._stack;
    uVar2 = getProxyPredicate(pEVar9,sort);
    local_48._content = 1;
    local_40 = 5;
    pEVar9 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar3 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar9 = (EqualityProxyMono *)pSVar10;
    }
    *local_68._cursor = pLVar3;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar9,sort);
    local_48._content = 5;
    local_40 = 1;
    pEVar9 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar3 = Kernel::Literal::create(uVar2,2,true,&local_48);
    if (local_68._cursor == local_68._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar9 = (EqualityProxyMono *)pSVar11;
    }
    *local_68._cursor = pLVar3;
    local_68._cursor = local_68._cursor + 1;
    pCVar4 = createEqProxyAxiom(pEVar9,&local_68);
    pUVar1 = *units;
    pUVar5 = (UnitList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar5->_head = &pCVar4->super_Unit;
    pUVar5->_tail = pUVar1;
    *units = pUVar5;
    pEVar9 = pEVar7;
  }
  if ((this->_opt & ~RS) == RST) {
    local_68._cursor = local_68._stack;
    uVar2 = getProxyPredicate(pEVar9,sort);
    local_48._content = 1;
    local_40 = 5;
    pEVar7 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar3 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar7 = (EqualityProxyMono *)pSVar12;
    }
    *local_68._cursor = pLVar3;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar7,sort);
    local_48._content = 5;
    local_40 = 9;
    pEVar7 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar3 = Kernel::Literal::create(uVar2,2,false,&local_48);
    if (local_68._cursor == local_68._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar7 = (EqualityProxyMono *)pSVar13;
    }
    *local_68._cursor = pLVar3;
    local_68._cursor = local_68._cursor + 1;
    uVar2 = getProxyPredicate(pEVar7,sort);
    local_48._content = 1;
    local_40 = 9;
    pEVar7 = (EqualityProxyMono *)(ulong)uVar2;
    pLVar3 = Kernel::Literal::create(uVar2,2,true,&local_48);
    if (local_68._cursor == local_68._end) {
      ::Lib::Stack<Kernel::Literal_*>::expand(&local_68);
      pEVar7 = (EqualityProxyMono *)pSVar14;
    }
    *local_68._cursor = pLVar3;
    local_68._cursor = local_68._cursor + 1;
    pCVar4 = createEqProxyAxiom(pEVar7,&local_68);
    pUVar1 = *units;
    pUVar5 = (UnitList *)
             ::Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pUVar5->_head = &pCVar4->super_Unit;
    pUVar5->_tail = pUVar1;
    *units = pUVar5;
  }
  if (local_68._stack != (Literal **)0x0) {
    uVar6 = local_68._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar6 == 0) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
    }
    else if (uVar6 < 0x11) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
    }
    else if (uVar6 < 0x19) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
    }
    else if (uVar6 < 0x21) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
    }
    else if (uVar6 < 0x31) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
    }
    else if (uVar6 < 0x41) {
      *local_68._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
    }
    else {
      operator_delete(local_68._stack,0x10);
    }
  }
  return;
}

Assistant:

void EqualityProxyMono::addLocalAxioms(UnitList*& units, TermList sort)
{
  // reflexivity
  Stack<Literal*> lits;
  lits.push(makeProxyLiteral(true,TermList(0,false),TermList(0,false), sort));
  UnitList::push(createEqProxyAxiom(lits),units);

  // symmetry
  if (_opt == Options::EqualityProxy::RS || _opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(0,false),TermList(1,false), sort));
    lits.push(makeProxyLiteral(true,TermList(1,false),TermList(0,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
  // transitivity
  if (_opt == Options::EqualityProxy::RST || _opt == Options::EqualityProxy::RSTC) {
    lits.reset();
    lits.push(makeProxyLiteral(false,TermList(0,false),TermList(1,false), sort));
    lits.push(makeProxyLiteral(false,TermList(1,false),TermList(2,false), sort));
    lits.push(makeProxyLiteral(true,TermList(0,false),TermList(2,false), sort));
    UnitList::push(createEqProxyAxiom(lits),units);
  }
}